

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
               (interval_t *ldata,interval_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  long lVar10;
  idx_t idx_in_entry;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  sel_t *psVar16;
  long lVar17;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  sel_t *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar16 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar15 = 0;
      do {
        uVar8 = uVar15;
        if (psVar16 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar16[uVar15];
        }
        uVar13 = uVar15;
        if (psVar2 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar2[uVar15];
        }
        lVar17._0_4_ = ldata[uVar8].months;
        lVar17._4_4_ = ldata[uVar8].days;
        lVar12._0_4_ = rdata[uVar13].months;
        lVar12._4_4_ = rdata[uVar13].days;
        lVar11 = (lVar17 >> 0x20) + ldata[uVar8].micros / 86400000000;
        lVar10 = (long)(int)(undefined4)lVar17 + lVar11 / 0x1e;
        lVar14 = (lVar12 >> 0x20) + rdata[uVar13].micros / 86400000000;
        lVar17 = (long)(int)(undefined4)lVar12 + lVar14 / 0x1e;
        bVar7 = true;
        if (lVar10 <= lVar17) {
          if (lVar10 < lVar17) {
            bVar7 = false;
          }
          else {
            lVar11 = lVar11 % 0x1e;
            lVar14 = lVar14 % 0x1e;
            if (lVar11 <= lVar14) {
              bVar7 = rdata[uVar13].micros % 86400000000 < ldata[uVar8].micros % 86400000000 &&
                      lVar14 <= lVar11;
            }
          }
        }
        result_data[uVar15] = bVar7;
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else if (count != 0) {
    psVar16 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar15 = 0;
    local_40 = psVar16;
    do {
      uVar8 = uVar15;
      if (psVar16 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar16[uVar15];
      }
      uVar13 = uVar15;
      if (psVar2 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar2[uVar15];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))) {
        lVar14._0_4_ = ldata[uVar8].months;
        lVar14._4_4_ = ldata[uVar8].days;
        lVar10._0_4_ = rdata[uVar13].months;
        lVar10._4_4_ = rdata[uVar13].days;
        lVar12 = (lVar14 >> 0x20) + ldata[uVar8].micros / 86400000000;
        lVar17 = (long)(int)(undefined4)lVar14 + lVar12 / 0x1e;
        lVar14 = (lVar10 >> 0x20) + rdata[uVar13].micros / 86400000000;
        lVar10 = (long)(int)(undefined4)lVar10 + lVar14 / 0x1e;
        bVar7 = true;
        if (lVar17 <= lVar10) {
          if (lVar17 < lVar10) {
            bVar7 = false;
          }
          else {
            lVar12 = lVar12 % 0x1e;
            lVar14 = lVar14 % 0x1e;
            bVar7 = true;
            if (lVar12 <= lVar14) {
              bVar7 = rdata[uVar13].micros % 86400000000 < ldata[uVar8].micros % 86400000000 &&
                      lVar14 <= lVar12;
            }
          }
        }
        result_data[uVar15] = bVar7;
        psVar16 = local_40;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var6 = p_Stack_50;
          peVar5 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar4 = (byte)uVar15 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}